

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawing.c
# Opt level: O0

void al_clear_to_color(ALLEGRO_COLOR color)

{
  _Bool _Var1;
  uint uVar2;
  int format;
  ALLEGRO_BITMAP *bitmap;
  ALLEGRO_DISPLAY *pAVar3;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_BITMAP *target;
  ALLEGRO_COLOR *in_stack_00000058;
  ALLEGRO_BITMAP *in_stack_00000060;
  ALLEGRO_COLOR local_10;
  
  bitmap = al_get_target_bitmap();
  uVar2 = al_get_bitmap_flags(bitmap);
  if ((uVar2 & 1) == 0) {
    format = al_get_bitmap_format(bitmap);
    _Var1 = _al_pixel_format_is_compressed(format);
    if (!_Var1) {
      pAVar3 = _al_get_bitmap_display(bitmap);
      (*pAVar3->vt->clear)(pAVar3,&local_10);
      return;
    }
  }
  _al_clear_bitmap_by_locking(in_stack_00000060,in_stack_00000058);
  return;
}

Assistant:

void al_clear_to_color(ALLEGRO_COLOR color)
{
   ALLEGRO_BITMAP *target = al_get_target_bitmap();
   ASSERT(target);

   if (al_get_bitmap_flags(target) & ALLEGRO_MEMORY_BITMAP ||
       _al_pixel_format_is_compressed(al_get_bitmap_format(target))) {
      _al_clear_bitmap_by_locking(target, &color);
   }
   else {
      ALLEGRO_DISPLAY *display = _al_get_bitmap_display(target);
      ASSERT(display);
      ASSERT(display->vt);
      display->vt->clear(display, &color);
   }
}